

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O1

bool __thiscall Am_Data_Locator::Find_File(Am_Data_Locator *this,Am_Filename *f,Am_Filename *found)

{
  bool bVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  Am_Filename fullname;
  Am_Filename local_50;
  
  if ((((f->filename)._M_string_length == 0) || (*(f->filename)._M_dataplus._M_p == '/')) &&
     (bVar1 = Am_Filename::Exists(f), bVar1)) {
    std::__cxx11::string::_M_assign((string *)found);
    bVar1 = true;
  }
  else {
    p_Var3 = (this->search_list).
             super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    bVar1 = p_Var3 != (_List_node_base *)this;
    if (bVar1) {
      do {
        Am_Filename::Am_Filename(&local_50,(Am_Filename *)(p_Var3 + 1),f);
        bVar2 = Am_Filename::Exists(&local_50);
        if (bVar2) {
          std::__cxx11::string::_M_assign((string *)found);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
            operator_delete(local_50.filename._M_dataplus._M_p);
          }
          if (bVar2) {
            return bVar1;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
          operator_delete(local_50.filename._M_dataplus._M_p);
        }
        p_Var3 = (((dir_list_t *)&p_Var3->_M_next)->
                 super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        bVar1 = p_Var3 != (_List_node_base *)this;
      } while (bVar1);
    }
  }
  return bVar1;
}

Assistant:

bool
Am_Data_Locator::Find_File(const Am_Filename &f, Am_Filename &found) const
{
  if (!(f.Is_Relative()) && f.Exists()) // Checks the filename itself
  {
    found = f;
    return true;
  } else // Try to complete the name with some search directory
  {
    for (dir_list_t::const_iterator it = search_list.begin();
         it != search_list.end(); ++it) {
      const Am_Filename fullname((*it).first, f);
      if (fullname.Exists()) {
        found = fullname;
        return true;
      }
    }
  }
  return false;
}